

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall
matchit::impl::Id<mathiu::impl::RelationalKind>::matchValue<mathiu::impl::RelationalKind_const&>
          (Id<mathiu::impl::RelationalKind> *this,RelationalKind *v)

{
  bool bVar1;
  RelationalKind *lhs;
  IdBlockBase<mathiu::impl::RelationalKind> *this_00;
  ValueVariant<mathiu::impl::RelationalKind> *pVVar2;
  RelationalKind *v_local;
  Id<mathiu::impl::RelationalKind> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    lhs = internalValue(this);
    this_local._7_1_ = IdTraits<mathiu::impl::RelationalKind>::equal(lhs,v);
  }
  else {
    this_00 = &block(this)->super_IdBlockBase<mathiu::impl::RelationalKind>;
    pVVar2 = IdBlockBase<mathiu::impl::RelationalKind>::variant(this_00);
    IdUtil<mathiu::impl::RelationalKind>::bindValue<mathiu::impl::RelationalKind_const&>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }